

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::LazilyBuildDependenciesTest_Service_Test::
~LazilyBuildDependenciesTest_Service_Test(LazilyBuildDependenciesTest_Service_Test *this)

{
  (this->super_LazilyBuildDependenciesTest).super_Test._vptr_Test =
       (_func_int **)&PTR__LazilyBuildDependenciesTest_0188b1c8;
  DescriptorPool::~DescriptorPool(&(this->super_LazilyBuildDependenciesTest).pool_);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase
            (&(this->super_LazilyBuildDependenciesTest).db_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(LazilyBuildDependenciesTest, Service) {
  ParseProtoAndAddToDb(R"pb(
    name: 'foo.proto'
    package: 'proto2_unittest'
    dependency: 'message1.proto'
    dependency: 'message2.proto'
    dependency: 'message3.proto'
    dependency: 'message4.proto'
    service {
      name: 'LazyService'
      method {
        name: 'A'
        input_type: '.proto2_unittest.Message1'
        output_type: '.proto2_unittest.Message2'
      }
    })pb");
  AddSimpleMessageProtoFileToDb("message1", "Message1");
  AddSimpleMessageProtoFileToDb("message2", "Message2");
  AddSimpleMessageProtoFileToDb("message3", "Message3");
  AddSimpleMessageProtoFileToDb("message4", "Message4");

  const FileDescriptor* file = pool_.FindFileByName("foo.proto");

  // Verify calling FindServiceByName or FindMethodByName doesn't build the
  // files defining the input and output type, and input_type() and
  // output_type() does indeed build the appropriate files.
  const ServiceDescriptor* service = file->FindServiceByName("LazyService");
  EXPECT_TRUE(service != nullptr);
  const MethodDescriptor* method = service->FindMethodByName("A");
  EXPECT_FALSE(pool_.InternalIsFileLoaded("message1.proto"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("message2.proto"));
  EXPECT_TRUE(method != nullptr);
  EXPECT_TRUE(method->input_type() != nullptr);
  EXPECT_TRUE(pool_.InternalIsFileLoaded("message1.proto"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("message2.proto"));
  EXPECT_TRUE(method->output_type() != nullptr);
  EXPECT_TRUE(pool_.InternalIsFileLoaded("message2.proto"));
}